

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O2

void __thiscall LLVMBC::StreamState::append(StreamState *this,ExtractValueInst *ext,bool decl)

{
  uint uVar1;
  undefined7 in_register_00000011;
  uint i;
  ulong uVar2;
  uint64_t local_38;
  Value *local_30;
  Type *local_28;
  
  if ((int)CONCAT71(in_register_00000011,decl) == 0) {
    local_38 = Value::get_tween_id((Value *)ext);
    append<char_const(&)[2],unsigned_long>(this,(char (*) [2])0x1a7902,&local_38);
  }
  else {
    local_38 = Value::get_tween_id((Value *)ext);
    local_28 = Value::getType((Value *)ext);
    local_30 = ExtractValueInst::getAggregateOperand(ext);
    append<char_const(&)[2],unsigned_long,char_const(&)[4],char_const(&)[14],LLVMBC::Type*,char_const(&)[2],LLVMBC::Value*>
              (this,(char (*) [2])0x1a7902,&local_38,(char (*) [4])" = ",
               (char (*) [14])"extractvalue ",&local_28,(char (*) [2])0x1a77b6,&local_30);
    uVar2 = 0;
    while( true ) {
      uVar1 = ExtractValueInst::getNumIndices(ext);
      if (uVar1 <= uVar2) break;
      std::operator<<((ostream *)this,", ");
      ExtractValueInst::getIndices(ext);
      std::ostream::_M_insert<unsigned_long>((ulong)this);
      uVar2 = uVar2 + 1;
    }
  }
  return;
}

Assistant:

void StreamState::append(ExtractValueInst *ext, bool decl)
{
	if (decl)
	{
		append("%", ext->get_tween_id(), " = ", "extractvalue ", ext->getType(), " ", ext->getAggregateOperand());
		for (unsigned i = 0; i < ext->getNumIndices(); i++)
		{
			append(", ");
			append(ext->getIndices()[i]);
		}
	}
	else
	{
		append("%", ext->get_tween_id());
	}
}